

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Mish_x86_avx2::forward_inplace(Mish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  ulong uVar13;
  uint uVar14;
  undefined1 (*pauVar15) [16];
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [32];
  long lVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  
  uVar16 = bottom_top_blob->c;
  uVar18 = (ulong)uVar16;
  uVar17 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar16) {
      auVar108 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                    CONCAT424(0x42b0c0a5,
                                              CONCAT420(0x42b0c0a5,
                                                        CONCAT416(0x42b0c0a5,
                                                                  CONCAT412(0x42b0c0a5,
                                                                            CONCAT48(0x42b0c0a5,
                                                                                                                                                                          
                                                  0x42b0c0a542b0c0a5)))))));
      auVar110 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar126 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar71._8_4_ = 0x3f000000;
      auVar71._0_8_ = 0x3f0000003f000000;
      auVar71._12_4_ = 0x3f000000;
      auVar71._16_4_ = 0x3f000000;
      auVar71._20_4_ = 0x3f000000;
      auVar71._24_4_ = 0x3f000000;
      auVar71._28_4_ = 0x3f000000;
      uVar13 = 0;
      auVar35 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      auVar94 = ZEXT3264(CONCAT428(0x3f317218,
                                   CONCAT424(0x3f317218,
                                             CONCAT420(0x3f317218,
                                                       CONCAT416(0x3f317218,
                                                                 CONCAT412(0x3f317218,
                                                                           CONCAT48(0x3f317218,
                                                                                                                                                                        
                                                  0x3f3172183f317218)))))));
      auVar138 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      auVar166 = ZEXT3264(CONCAT428(0x3ab743ce,
                                    CONCAT424(0x3ab743ce,
                                              CONCAT420(0x3ab743ce,
                                                        CONCAT416(0x3ab743ce,
                                                                  CONCAT412(0x3ab743ce,
                                                                            CONCAT48(0x3ab743ce,
                                                                                                                                                                          
                                                  0x3ab743ce3ab743ce)))))));
      auVar73 = ZEXT3264(CONCAT428(0x3c088908,
                                   CONCAT424(0x3c088908,
                                             CONCAT420(0x3c088908,
                                                       CONCAT416(0x3c088908,
                                                                 CONCAT412(0x3c088908,
                                                                           CONCAT48(0x3c088908,
                                                                                                                                                                        
                                                  0x3c0889083c088908)))))));
      auVar153 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                    CONCAT424(0x3d2aa9c1,
                                              CONCAT420(0x3d2aa9c1,
                                                        CONCAT416(0x3d2aa9c1,
                                                                  CONCAT412(0x3d2aa9c1,
                                                                            CONCAT48(0x3d2aa9c1,
                                                                                                                                                                          
                                                  0x3d2aa9c13d2aa9c1)))))));
      auVar170 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                    CONCAT424(0x3e2aaaaa,
                                              CONCAT420(0x3e2aaaaa,
                                                        CONCAT416(0x3e2aaaaa,
                                                                  CONCAT412(0x3e2aaaaa,
                                                                            CONCAT48(0x3e2aaaaa,
                                                                                                                                                                          
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60._16_4_ = 0x3f800000;
      auVar60._20_4_ = 0x3f800000;
      auVar60._24_4_ = 0x3f800000;
      auVar60._28_4_ = 0x3f800000;
      auVar28._8_4_ = 0x807fffff;
      auVar28._0_8_ = 0x807fffff807fffff;
      auVar28._12_4_ = 0x807fffff;
      auVar28._16_4_ = 0x807fffff;
      auVar28._20_4_ = 0x807fffff;
      auVar28._24_4_ = 0x807fffff;
      auVar28._28_4_ = 0x807fffff;
      do {
        if (0 < (int)uVar17) {
          pauVar19 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar16 = uVar17;
          do {
            auVar5 = *pauVar19;
            auVar40 = auVar108._0_32_;
            auVar39 = vminps_avx(auVar40,auVar5);
            auVar105 = auVar110._0_32_;
            auVar58 = vmaxps_avx(auVar105,auVar39);
            auVar41 = auVar126._0_32_;
            auVar56 = vfmadd213ps_fma(auVar41,auVar58,auVar71);
            auVar4 = vroundps_avx(ZEXT1632(auVar56),1);
            auVar39 = vcmpps_avx(ZEXT1632(auVar56),auVar4,1);
            auVar39 = vandps_avx(auVar39,auVar35._0_32_);
            auVar4 = vsubps_avx(auVar4,auVar39);
            auVar33 = auVar94._0_32_;
            auVar24 = vfnmadd231ps_fma(auVar58,auVar4,auVar33);
            auVar58 = ZEXT1632(auVar24);
            fVar1 = auVar24._0_4_;
            fVar21 = auVar24._4_4_;
            fVar2 = auVar24._8_4_;
            fVar3 = auVar24._12_4_;
            auVar39._28_4_ = auVar39._28_4_;
            auVar39._0_28_ =
                 ZEXT1628(CONCAT412(fVar3 * fVar3,
                                    CONCAT48(fVar2 * fVar2,CONCAT44(fVar21 * fVar21,fVar1 * fVar1)))
                         );
            auVar117 = auVar138._0_32_;
            auVar97 = auVar166._0_32_;
            auVar56 = vfmadd213ps_fma(auVar117,auVar58,auVar97);
            auVar32 = auVar73._0_32_;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar58,auVar32);
            auVar93 = auVar153._0_32_;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar58,auVar93);
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar170._0_32_);
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar71);
            auVar29._0_4_ = fVar1 + auVar35._0_4_;
            auVar29._4_4_ = fVar21 + auVar35._4_4_;
            auVar29._8_4_ = fVar2 + auVar35._8_4_;
            auVar29._12_4_ = fVar3 + auVar35._12_4_;
            auVar29._16_4_ = auVar35._16_4_ + 0.0;
            auVar29._20_4_ = auVar35._20_4_ + 0.0;
            auVar29._24_4_ = auVar35._24_4_ + 0.0;
            auVar29._28_4_ = auVar35._28_4_ + 0.0;
            auVar56 = vfmadd231ps_fma(auVar29,auVar39,ZEXT1632(auVar56));
            auVar38._0_4_ = (int)auVar4._0_4_;
            auVar38._4_4_ = (int)auVar4._4_4_;
            auVar38._8_4_ = (int)auVar4._8_4_;
            auVar38._12_4_ = (int)auVar4._12_4_;
            auVar38._16_4_ = (int)auVar4._16_4_;
            auVar38._20_4_ = (int)auVar4._20_4_;
            auVar38._24_4_ = (int)auVar4._24_4_;
            auVar38._28_4_ = (int)auVar4._28_4_;
            auVar39 = vpslld_avx2(auVar38,0x17);
            auVar39 = vpaddd_avx2(auVar39,auVar60);
            auVar56 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar56),auVar35._0_32_);
            auVar30._8_4_ = 0x800000;
            auVar30._0_8_ = 0x80000000800000;
            auVar30._12_4_ = 0x800000;
            auVar30._16_4_ = 0x800000;
            auVar30._20_4_ = 0x800000;
            auVar30._24_4_ = 0x800000;
            auVar30._28_4_ = 0x800000;
            auVar39 = vmaxps_avx(ZEXT1632(auVar56),auVar30);
            auVar58 = vpsrld_avx2(auVar39,0x17);
            auVar39 = vandps_avx(auVar39,auVar28);
            auVar102._8_4_ = 0x3f000000;
            auVar102._0_8_ = 0x3f0000003f000000;
            auVar102._12_4_ = 0x3f000000;
            auVar102._16_4_ = 0x3f000000;
            auVar102._20_4_ = 0x3f000000;
            auVar102._24_4_ = 0x3f000000;
            auVar102._28_4_ = 0x3f000000;
            auVar4 = vorps_avx(auVar39,auVar102);
            auVar103._8_4_ = 0xffffff82;
            auVar103._0_8_ = 0xffffff82ffffff82;
            auVar103._12_4_ = 0xffffff82;
            auVar103._16_4_ = 0xffffff82;
            auVar103._20_4_ = 0xffffff82;
            auVar103._24_4_ = 0xffffff82;
            auVar103._28_4_ = 0xffffff82;
            auVar6 = vpaddd_avx2(auVar58,auVar103);
            auVar78._8_4_ = 0x3f3504f3;
            auVar78._0_8_ = 0x3f3504f33f3504f3;
            auVar78._12_4_ = 0x3f3504f3;
            auVar78._16_4_ = 0x3f3504f3;
            auVar78._20_4_ = 0x3f3504f3;
            auVar78._24_4_ = 0x3f3504f3;
            auVar78._28_4_ = 0x3f3504f3;
            auVar58 = vcmpps_avx(auVar4,auVar78,1);
            auVar39 = vandps_avx(auVar58,auVar4);
            auVar31._0_4_ = auVar39._0_4_ + auVar4._0_4_ + -1.0;
            auVar31._4_4_ = auVar39._4_4_ + auVar4._4_4_ + -1.0;
            auVar31._8_4_ = auVar39._8_4_ + auVar4._8_4_ + -1.0;
            auVar31._12_4_ = auVar39._12_4_ + auVar4._12_4_ + -1.0;
            auVar31._16_4_ = auVar39._16_4_ + auVar4._16_4_ + -1.0;
            auVar31._20_4_ = auVar39._20_4_ + auVar4._20_4_ + -1.0;
            auVar31._24_4_ = auVar39._24_4_ + auVar4._24_4_ + -1.0;
            auVar31._28_4_ = auVar39._28_4_ + auVar4._28_4_ + -1.0;
            auVar108 = ZEXT3264(auVar40);
            auVar110 = ZEXT3264(auVar105);
            auVar126 = ZEXT3264(auVar41);
            auVar4 = vcmpps_avx(ZEXT1632(auVar56),ZEXT832(0) << 0x20,2);
            auVar138 = ZEXT3264(auVar117);
            auVar166 = ZEXT3264(auVar97);
            auVar73 = ZEXT3264(auVar32);
            auVar153 = ZEXT3264(auVar93);
            auVar94 = ZEXT3264(auVar33);
            auVar79._8_4_ = 0x3f800000;
            auVar79._0_8_ = 0x3f8000003f800000;
            auVar79._12_4_ = 0x3f800000;
            auVar79._16_4_ = 0x3f800000;
            auVar79._20_4_ = 0x3f800000;
            auVar79._24_4_ = 0x3f800000;
            auVar79._28_4_ = 0x3f800000;
            auVar35 = ZEXT3264(auVar79);
            auVar168._8_4_ = 0x3e2aaaaa;
            auVar168._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar168._12_4_ = 0x3e2aaaaa;
            auVar168._16_4_ = 0x3e2aaaaa;
            auVar168._20_4_ = 0x3e2aaaaa;
            auVar168._24_4_ = 0x3e2aaaaa;
            auVar168._28_4_ = 0x3e2aaaaa;
            auVar170 = ZEXT3264(auVar168);
            auVar6 = vcvtdq2ps_avx(auVar6);
            auVar39 = vandps_avx(auVar58,auVar79);
            auVar39 = vsubps_avx(auVar6,auVar39);
            auVar104._8_4_ = 0x3d9021bb;
            auVar104._0_8_ = 0x3d9021bb3d9021bb;
            auVar104._12_4_ = 0x3d9021bb;
            auVar104._16_4_ = 0x3d9021bb;
            auVar104._20_4_ = 0x3d9021bb;
            auVar104._24_4_ = 0x3d9021bb;
            auVar104._28_4_ = 0x3d9021bb;
            auVar128._8_4_ = 0xbdebd1b8;
            auVar128._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar128._12_4_ = 0xbdebd1b8;
            auVar128._16_4_ = 0xbdebd1b8;
            auVar128._20_4_ = 0xbdebd1b8;
            auVar128._24_4_ = 0xbdebd1b8;
            auVar128._28_4_ = 0xbdebd1b8;
            auVar56 = vfmadd213ps_fma(auVar104,auVar31,auVar128);
            auVar129._8_4_ = 0x3def251a;
            auVar129._0_8_ = 0x3def251a3def251a;
            auVar129._12_4_ = 0x3def251a;
            auVar129._16_4_ = 0x3def251a;
            auVar129._20_4_ = 0x3def251a;
            auVar129._24_4_ = 0x3def251a;
            auVar129._28_4_ = 0x3def251a;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar129);
            auVar130._8_4_ = 0xbdfe5d4f;
            auVar130._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar130._12_4_ = 0xbdfe5d4f;
            auVar130._16_4_ = 0xbdfe5d4f;
            auVar130._20_4_ = 0xbdfe5d4f;
            auVar130._24_4_ = 0xbdfe5d4f;
            auVar130._28_4_ = 0xbdfe5d4f;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar130);
            auVar131._8_4_ = 0x3e11e9bf;
            auVar131._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar131._12_4_ = 0x3e11e9bf;
            auVar131._16_4_ = 0x3e11e9bf;
            auVar131._20_4_ = 0x3e11e9bf;
            auVar131._24_4_ = 0x3e11e9bf;
            auVar131._28_4_ = 0x3e11e9bf;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar131);
            auVar132._8_4_ = 0xbe2aae50;
            auVar132._0_8_ = 0xbe2aae50be2aae50;
            auVar132._12_4_ = 0xbe2aae50;
            auVar132._16_4_ = 0xbe2aae50;
            auVar132._20_4_ = 0xbe2aae50;
            auVar132._24_4_ = 0xbe2aae50;
            auVar132._28_4_ = 0xbe2aae50;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar132);
            auVar133._8_4_ = 0x3e4cceac;
            auVar133._0_8_ = 0x3e4cceac3e4cceac;
            auVar133._12_4_ = 0x3e4cceac;
            auVar133._16_4_ = 0x3e4cceac;
            auVar133._20_4_ = 0x3e4cceac;
            auVar133._24_4_ = 0x3e4cceac;
            auVar133._28_4_ = 0x3e4cceac;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar133);
            auVar134._8_4_ = 0xbe7ffffc;
            auVar134._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar134._12_4_ = 0xbe7ffffc;
            auVar134._16_4_ = 0xbe7ffffc;
            auVar134._20_4_ = 0xbe7ffffc;
            auVar134._24_4_ = 0xbe7ffffc;
            auVar134._28_4_ = 0xbe7ffffc;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar134);
            auVar135._8_4_ = 0x3eaaaaaa;
            auVar135._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar135._12_4_ = 0x3eaaaaaa;
            auVar135._16_4_ = 0x3eaaaaaa;
            auVar135._20_4_ = 0x3eaaaaaa;
            auVar135._24_4_ = 0x3eaaaaaa;
            auVar135._28_4_ = 0x3eaaaaaa;
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar31,auVar135);
            auVar136._8_4_ = 0x7fffffff;
            auVar136._0_8_ = 0x7fffffff7fffffff;
            auVar136._12_4_ = 0x7fffffff;
            auVar136._16_4_ = 0x7fffffff;
            auVar136._20_4_ = 0x7fffffff;
            auVar136._24_4_ = 0x7fffffff;
            auVar136._28_4_ = 0x7fffffff;
            auVar24 = vfmsub213ps_fma(ZEXT1632(auVar56),auVar31,auVar71);
            auVar56 = vfmadd213ps_fma(auVar39,auVar33,auVar31);
            auVar58._4_4_ = auVar31._4_4_ * auVar31._4_4_;
            auVar58._0_4_ = auVar31._0_4_ * auVar31._0_4_;
            auVar58._8_4_ = auVar31._8_4_ * auVar31._8_4_;
            auVar58._12_4_ = auVar31._12_4_ * auVar31._12_4_;
            auVar58._16_4_ = auVar31._16_4_ * auVar31._16_4_;
            auVar58._20_4_ = auVar31._20_4_ * auVar31._20_4_;
            auVar58._24_4_ = auVar31._24_4_ * auVar31._24_4_;
            auVar58._28_4_ = auVar31._28_4_;
            auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar58,ZEXT1632(auVar24));
            auVar6._4_4_ = auVar56._4_4_ * -2.0;
            auVar6._0_4_ = auVar56._0_4_ * -2.0;
            auVar6._8_4_ = auVar56._8_4_ * -2.0;
            auVar6._12_4_ = auVar56._12_4_ * -2.0;
            auVar6._16_4_ = 0x80000000;
            auVar6._20_4_ = 0x80000000;
            auVar6._24_4_ = 0x80000000;
            auVar6._28_4_ = 0xc0000000;
            auVar39 = vblendvps_avx(auVar6,auVar136,auVar4);
            auVar39 = vminps_avx(auVar40,auVar39);
            auVar58 = vmaxps_avx(auVar105,auVar39);
            auVar56 = vfmadd213ps_fma(auVar41,auVar58,auVar71);
            auVar4 = vroundps_avx(ZEXT1632(auVar56),1);
            auVar39 = vcmpps_avx(ZEXT1632(auVar56),auVar4,1);
            auVar39 = vandps_avx(auVar39,auVar79);
            auVar39 = vsubps_avx(auVar4,auVar39);
            auVar24 = vfnmadd231ps_fma(auVar58,auVar39,auVar33);
            auVar58 = ZEXT1632(auVar24);
            fVar1 = auVar24._0_4_;
            fVar21 = auVar24._4_4_;
            fVar2 = auVar24._8_4_;
            fVar3 = auVar24._12_4_;
            auVar4._28_4_ = auVar4._28_4_;
            auVar4._0_28_ =
                 ZEXT1628(CONCAT412(fVar3 * fVar3,
                                    CONCAT48(fVar2 * fVar2,CONCAT44(fVar21 * fVar21,fVar1 * fVar1)))
                         );
            auVar56 = vfmadd213ps_fma(auVar117,auVar58,auVar97);
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar58,auVar32);
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar58,auVar93);
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar168);
            auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar71);
            auVar32._0_4_ = fVar1 + 1.0;
            auVar32._4_4_ = fVar21 + 1.0;
            auVar32._8_4_ = fVar2 + 1.0;
            auVar32._12_4_ = fVar3 + 1.0;
            auVar32._16_4_ = 0x3f800000;
            auVar32._20_4_ = 0x3f800000;
            auVar32._24_4_ = 0x3f800000;
            auVar32._28_4_ = 0x3f800000;
            auVar56 = vfmadd231ps_fma(auVar32,auVar4,ZEXT1632(auVar56));
            auVar105._8_4_ = 0xbf800000;
            auVar105._0_8_ = 0xbf800000bf800000;
            auVar105._12_4_ = 0xbf800000;
            auVar105._16_4_ = 0xbf800000;
            auVar105._20_4_ = 0xbf800000;
            auVar105._24_4_ = 0xbf800000;
            auVar105._28_4_ = 0xbf800000;
            auVar40._0_4_ = (int)auVar39._0_4_;
            auVar40._4_4_ = (int)auVar39._4_4_;
            auVar40._8_4_ = (int)auVar39._8_4_;
            auVar40._12_4_ = (int)auVar39._12_4_;
            auVar40._16_4_ = (int)auVar39._16_4_;
            auVar40._20_4_ = (int)auVar39._20_4_;
            auVar40._24_4_ = (int)auVar39._24_4_;
            auVar40._28_4_ = (int)auVar39._28_4_;
            auVar39 = vpslld_avx2(auVar40,0x17);
            auVar39 = vpaddd_avx2(auVar39,auVar60);
            auVar56 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar56),auVar79);
            auVar39 = vrcpps_avx(ZEXT1632(auVar56));
            auVar56 = vfmsub213ps_fma(ZEXT1632(auVar56),auVar39,auVar79);
            auVar56 = vfnmadd132ps_fma(ZEXT1632(auVar56),auVar39,auVar39);
            auVar33._8_4_ = 0xc0000000;
            auVar33._0_8_ = 0xc0000000c0000000;
            auVar33._12_4_ = 0xc0000000;
            auVar33._16_4_ = 0xc0000000;
            auVar33._20_4_ = 0xc0000000;
            auVar33._24_4_ = 0xc0000000;
            auVar33._28_4_ = 0xc0000000;
            auVar56 = vfnmadd213ps_fma(ZEXT1632(auVar56),auVar33,auVar105);
            local_78 = auVar5._0_4_;
            fStack_74 = auVar5._4_4_;
            fStack_70 = auVar5._8_4_;
            fStack_6c = auVar5._12_4_;
            fStack_68 = auVar5._16_4_;
            fStack_64 = auVar5._20_4_;
            fStack_60 = auVar5._24_4_;
            auVar5._4_4_ = auVar56._4_4_ * fStack_74;
            auVar5._0_4_ = auVar56._0_4_ * local_78;
            auVar5._8_4_ = auVar56._8_4_ * fStack_70;
            auVar5._12_4_ = auVar56._12_4_ * fStack_6c;
            auVar5._16_4_ = fStack_68 * 0.0;
            auVar5._20_4_ = fStack_64 * 0.0;
            auVar5._24_4_ = fStack_60 * 0.0;
            auVar5._28_4_ = 0xc0000000;
            *pauVar19 = auVar5;
            pauVar19 = pauVar19 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar18);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar16) {
      uVar13 = 0;
      auVar153 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
      auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar74._8_4_ = 0x3f000000;
      auVar74._0_8_ = 0x3f0000003f000000;
      auVar74._12_4_ = 0x3f000000;
      auVar108 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar95._8_4_ = 0x3f317218;
      auVar95._0_8_ = 0x3f3172183f317218;
      auVar95._12_4_ = 0x3f317218;
      auVar114._8_4_ = 0x39506967;
      auVar114._0_8_ = 0x3950696739506967;
      auVar114._12_4_ = 0x39506967;
      auVar94 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      auVar110 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
      auVar126 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
      auVar138 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
      auVar73 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar36._8_4_ = 0x807fffff;
      auVar36._0_8_ = 0x807fffff807fffff;
      auVar36._12_4_ = 0x807fffff;
      do {
        if (0 < (int)uVar17) {
          pauVar15 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar16 = uVar17;
          do {
            auVar56 = *pauVar15;
            auVar65 = auVar110._0_16_;
            auVar68 = auVar153._0_16_;
            auVar24 = vminps_avx(auVar68,auVar56);
            auVar64 = vmaxps_avx(auVar24,auVar35._0_16_);
            auVar46._8_4_ = 0x3fb8aa3b;
            auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar46._12_4_ = 0x3fb8aa3b;
            auVar24 = vfmadd213ps_fma(auVar46,auVar64,auVar74);
            auVar22._0_4_ = (int)auVar24._0_4_;
            auVar22._4_4_ = (int)auVar24._4_4_;
            auVar22._8_4_ = (int)auVar24._8_4_;
            auVar22._12_4_ = (int)auVar24._12_4_;
            auVar99 = vcvtdq2ps_avx(auVar22);
            auVar24 = vcmpps_avx(auVar24,auVar99,1);
            auVar57 = auVar108._0_16_;
            auVar24 = vandps_avx(auVar24,auVar57);
            auVar24 = vsubps_avx(auVar99,auVar24);
            auVar64 = vfnmadd231ps_fma(auVar64,auVar24,auVar95);
            fVar1 = auVar64._0_4_;
            auVar47._0_4_ = fVar1 * fVar1;
            fVar21 = auVar64._4_4_;
            auVar47._4_4_ = fVar21 * fVar21;
            fVar2 = auVar64._8_4_;
            auVar47._8_4_ = fVar2 * fVar2;
            fVar3 = auVar64._12_4_;
            auVar47._12_4_ = fVar3 * fVar3;
            auVar37 = auVar94._0_16_;
            auVar99 = vfmadd213ps_fma(auVar114,auVar64,auVar37);
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar65);
            auVar66 = auVar126._0_16_;
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar66);
            auVar67 = auVar138._0_16_;
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar67);
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar74);
            auVar139._0_4_ = fVar1 + auVar108._0_4_;
            auVar139._4_4_ = fVar21 + auVar108._4_4_;
            auVar139._8_4_ = fVar2 + auVar108._8_4_;
            auVar139._12_4_ = fVar3 + auVar108._12_4_;
            auVar99 = vfmadd231ps_fma(auVar139,auVar47,auVar99);
            auVar23._0_4_ = (int)auVar24._0_4_;
            auVar23._4_4_ = (int)auVar24._4_4_;
            auVar23._8_4_ = (int)auVar24._8_4_;
            auVar23._12_4_ = (int)auVar24._12_4_;
            auVar24 = vpslld_avx(auVar23,0x17);
            auVar26 = auVar73._0_16_;
            auVar24 = vpaddd_avx(auVar24,auVar26);
            auVar55 = vfmadd213ps_fma(auVar24,auVar99,auVar57);
            auVar48._8_4_ = 0x800000;
            auVar48._0_8_ = 0x80000000800000;
            auVar48._12_4_ = 0x800000;
            auVar24 = vmaxps_avx(auVar55,auVar48);
            auVar99 = vpsrld_avx(auVar24,0x17);
            auVar24 = vandps_avx(auVar24,auVar36);
            auVar140._8_4_ = 0x3f000000;
            auVar140._0_8_ = 0x3f0000003f000000;
            auVar140._12_4_ = 0x3f000000;
            auVar64 = vorps_avx(auVar140,auVar24);
            auVar141._8_4_ = 0xffffff82;
            auVar141._0_8_ = 0xffffff82ffffff82;
            auVar141._12_4_ = 0xffffff82;
            auVar27 = vpaddd_avx(auVar141,auVar99);
            auVar111._8_4_ = 0x3f3504f3;
            auVar111._0_8_ = 0x3f3504f33f3504f3;
            auVar111._12_4_ = 0x3f3504f3;
            auVar99 = vcmpps_avx(auVar64,auVar111,1);
            auVar24 = vandps_avx(auVar99,auVar64);
            auVar49._0_4_ = auVar64._0_4_ + -1.0 + auVar24._0_4_;
            auVar49._4_4_ = auVar64._4_4_ + -1.0 + auVar24._4_4_;
            auVar49._8_4_ = auVar64._8_4_ + -1.0 + auVar24._8_4_;
            auVar49._12_4_ = auVar64._12_4_ + -1.0 + auVar24._12_4_;
            auVar64 = vcmpps_avx(auVar55,_DAT_0030b030,2);
            auVar27 = vcvtdq2ps_avx(auVar27);
            auVar24 = vandps_avx(auVar99,auVar57);
            auVar153 = ZEXT1664(auVar68);
            auVar110 = ZEXT1664(auVar65);
            auVar154._8_4_ = 0x3d9021bb;
            auVar154._0_8_ = 0x3d9021bb3d9021bb;
            auVar154._12_4_ = 0x3d9021bb;
            auVar24 = vsubps_avx(auVar27,auVar24);
            auVar155._8_4_ = 0xbdebd1b8;
            auVar155._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar155._12_4_ = 0xbdebd1b8;
            auVar99 = vfmadd213ps_fma(auVar154,auVar49,auVar155);
            auVar156._8_4_ = 0x3def251a;
            auVar156._0_8_ = 0x3def251a3def251a;
            auVar156._12_4_ = 0x3def251a;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar156);
            auVar157._8_4_ = 0xbdfe5d4f;
            auVar157._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar157._12_4_ = 0xbdfe5d4f;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar157);
            auVar158._8_4_ = 0x3e11e9bf;
            auVar158._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar158._12_4_ = 0x3e11e9bf;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar158);
            auVar159._8_4_ = 0xbe2aae50;
            auVar159._0_8_ = 0xbe2aae50be2aae50;
            auVar159._12_4_ = 0xbe2aae50;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar159);
            auVar160._8_4_ = 0x3e4cceac;
            auVar160._0_8_ = 0x3e4cceac3e4cceac;
            auVar160._12_4_ = 0x3e4cceac;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar160);
            auVar161._8_4_ = 0xbe7ffffc;
            auVar161._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar161._12_4_ = 0xbe7ffffc;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar161);
            auVar162._8_4_ = 0x3eaaaaaa;
            auVar162._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar162._12_4_ = 0x3eaaaaaa;
            auVar99 = vfmadd213ps_fma(auVar99,auVar49,auVar162);
            auVar99 = vfmsub213ps_fma(auVar99,auVar49,auVar74);
            auVar24 = vfmadd213ps_fma(auVar24,auVar95,auVar49);
            auVar50._0_4_ = auVar49._0_4_ * auVar49._0_4_;
            auVar50._4_4_ = auVar49._4_4_ * auVar49._4_4_;
            auVar50._8_4_ = auVar49._8_4_ * auVar49._8_4_;
            auVar50._12_4_ = auVar49._12_4_ * auVar49._12_4_;
            auVar24 = vfmadd231ps_fma(auVar24,auVar50,auVar99);
            auVar51._0_4_ = auVar24._0_4_ * -2.0;
            auVar51._4_4_ = auVar24._4_4_ * -2.0;
            auVar51._8_4_ = auVar24._8_4_ * -2.0;
            auVar51._12_4_ = auVar24._12_4_ * -2.0;
            auVar163._8_4_ = 0x40000000;
            auVar163._0_8_ = 0x4000000040000000;
            auVar163._12_4_ = 0x40000000;
            auVar84._8_4_ = 0x7fffffff;
            auVar84._0_8_ = 0x7fffffff7fffffff;
            auVar84._12_4_ = 0x7fffffff;
            auVar24 = vblendvps_avx(auVar51,auVar84,auVar64);
            auVar24 = vminps_avx(auVar68,auVar24);
            auVar52._8_4_ = 0xc2b0c0a5;
            auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar52._12_4_ = 0xc2b0c0a5;
            auVar64 = vmaxps_avx(auVar24,auVar52);
            auVar53._8_4_ = 0x3fb8aa3b;
            auVar53._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar53._12_4_ = 0x3fb8aa3b;
            auVar24 = vfmadd213ps_fma(auVar53,auVar64,auVar74);
            auVar85._0_4_ = (int)auVar24._0_4_;
            auVar85._4_4_ = (int)auVar24._4_4_;
            auVar85._8_4_ = (int)auVar24._8_4_;
            auVar85._12_4_ = (int)auVar24._12_4_;
            auVar99 = vcvtdq2ps_avx(auVar85);
            auVar24 = vcmpps_avx(auVar24,auVar99,1);
            auVar24 = vandps_avx(auVar24,auVar57);
            auVar24 = vsubps_avx(auVar99,auVar24);
            auVar64 = vfnmadd231ps_fma(auVar64,auVar24,auVar95);
            fVar1 = auVar64._0_4_;
            auVar86._0_4_ = fVar1 * fVar1;
            fVar21 = auVar64._4_4_;
            auVar86._4_4_ = fVar21 * fVar21;
            fVar2 = auVar64._8_4_;
            auVar86._8_4_ = fVar2 * fVar2;
            fVar3 = auVar64._12_4_;
            auVar86._12_4_ = fVar3 * fVar3;
            auVar99 = vfmadd213ps_fma(auVar114,auVar64,auVar37);
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar65);
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar66);
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar67);
            auVar99 = vfmadd213ps_fma(auVar99,auVar64,auVar74);
            auVar25._0_4_ = fVar1 + auVar108._0_4_;
            auVar25._4_4_ = fVar21 + auVar108._4_4_;
            auVar25._8_4_ = fVar2 + auVar108._8_4_;
            auVar25._12_4_ = fVar3 + auVar108._12_4_;
            auVar99 = vfmadd231ps_fma(auVar25,auVar86,auVar99);
            auVar108 = ZEXT1664(auVar57);
            auVar54._0_4_ = (int)auVar24._0_4_;
            auVar54._4_4_ = (int)auVar24._4_4_;
            auVar54._8_4_ = (int)auVar24._8_4_;
            auVar54._12_4_ = (int)auVar24._12_4_;
            auVar24 = vpslld_avx(auVar54,0x17);
            auVar24 = vpaddd_avx(auVar26,auVar24);
            auVar99 = vfmadd213ps_fma(auVar24,auVar99,auVar57);
            auVar24 = vrcpps_avx(auVar99);
            auVar87._0_4_ = auVar24._0_4_ + auVar24._0_4_;
            auVar87._4_4_ = auVar24._4_4_ + auVar24._4_4_;
            auVar87._8_4_ = auVar24._8_4_ + auVar24._8_4_;
            auVar87._12_4_ = auVar24._12_4_ + auVar24._12_4_;
            auVar99 = vfmsub213ps_fma(auVar99,auVar87,auVar163);
            auVar24 = vfnmadd213ps_fma(auVar99,auVar24,auVar87);
            auVar94 = ZEXT1664(auVar37);
            auVar126 = ZEXT1664(auVar66);
            auVar138 = ZEXT1664(auVar67);
            auVar73 = ZEXT1664(auVar26);
            auVar35 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar56 = vfmsub213ps_fma(auVar24,auVar56,auVar56);
            *pauVar15 = auVar56;
            pauVar15 = pauVar15 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar18);
    }
  }
  else if (0 < (int)uVar16) {
    uVar13 = 0;
    auVar117._8_4_ = 0x3f800000;
    auVar117._0_8_ = 0x3f8000003f800000;
    auVar117._12_4_ = 0x3f800000;
    auVar117._16_4_ = 0x3f800000;
    auVar117._20_4_ = 0x3f800000;
    auVar117._24_4_ = 0x3f800000;
    auVar117._28_4_ = 0x3f800000;
    auVar41._8_4_ = 0x807fffff;
    auVar41._0_8_ = 0x807fffff807fffff;
    auVar41._12_4_ = 0x807fffff;
    auVar41._16_4_ = 0x807fffff;
    auVar41._20_4_ = 0x807fffff;
    auVar41._24_4_ = 0x807fffff;
    auVar41._28_4_ = 0x807fffff;
    do {
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = 0x3f8000003f800000;
      auVar106._8_4_ = 0x3f000000;
      auVar106._0_8_ = 0x3f0000003f000000;
      auVar97._8_4_ = 0x3f317218;
      auVar97._0_8_ = 0x3f3172183f317218;
      auVar93._8_4_ = 0x3d2aa9c1;
      auVar93._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar116._12_4_ = 0x3f800000;
      auVar106._12_4_ = 0x3f000000;
      auVar97._12_4_ = 0x3f317218;
      auVar93._12_4_ = 0x3d2aa9c1;
      auVar116._16_4_ = 0x3f800000;
      auVar106._16_4_ = 0x3f000000;
      auVar97._16_4_ = 0x3f317218;
      auVar93._16_4_ = 0x3d2aa9c1;
      auVar116._20_4_ = 0x3f800000;
      auVar106._20_4_ = 0x3f000000;
      auVar97._20_4_ = 0x3f317218;
      auVar93._20_4_ = 0x3d2aa9c1;
      auVar116._24_4_ = 0x3f800000;
      auVar106._24_4_ = 0x3f000000;
      auVar97._24_4_ = 0x3f317218;
      auVar93._24_4_ = 0x3d2aa9c1;
      auVar116._28_4_ = 0x3f800000;
      auVar106._28_4_ = 0x3f000000;
      auVar97._28_4_ = 0x3f317218;
      auVar93._28_4_ = 0x3d2aa9c1;
      pauVar19 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar17 < 8) {
        uVar16 = 0;
      }
      else {
        iVar12 = 7;
        do {
          auVar28 = *pauVar19;
          auVar34._8_4_ = 0x42b0c0a5;
          auVar34._0_8_ = 0x42b0c0a542b0c0a5;
          auVar34._12_4_ = 0x42b0c0a5;
          auVar34._16_4_ = 0x42b0c0a5;
          auVar34._20_4_ = 0x42b0c0a5;
          auVar34._24_4_ = 0x42b0c0a5;
          auVar34._28_4_ = 0x42b0c0a5;
          auVar60 = vminps_avx(auVar28,auVar34);
          auVar151._8_4_ = 0xc2b0c0a5;
          auVar151._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar151._12_4_ = 0xc2b0c0a5;
          auVar151._16_4_ = 0xc2b0c0a5;
          auVar151._20_4_ = 0xc2b0c0a5;
          auVar151._24_4_ = 0xc2b0c0a5;
          auVar151._28_4_ = 0xc2b0c0a5;
          auVar71 = vmaxps_avx(auVar151,auVar60);
          auVar169._8_4_ = 0x3fb8aa3b;
          auVar169._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar169._12_4_ = 0x3fb8aa3b;
          auVar169._16_4_ = 0x3fb8aa3b;
          auVar169._20_4_ = 0x3fb8aa3b;
          auVar169._24_4_ = 0x3fb8aa3b;
          auVar169._28_4_ = 0x3fb8aa3b;
          auVar56 = vfmadd213ps_fma(auVar169,auVar71,auVar106);
          auVar5 = vroundps_avx(ZEXT1632(auVar56),1);
          auVar60 = vcmpps_avx(ZEXT1632(auVar56),auVar5,1);
          auVar60 = vandps_avx(auVar116,auVar60);
          auVar60 = vsubps_avx(auVar5,auVar60);
          auVar24 = vfnmadd231ps_fma(auVar71,auVar60,auVar97);
          auVar71 = ZEXT1632(auVar24);
          fVar1 = auVar24._0_4_;
          fVar21 = auVar24._4_4_;
          fVar2 = auVar24._8_4_;
          fVar3 = auVar24._12_4_;
          auVar7._28_4_ = auVar5._28_4_;
          auVar7._0_28_ =
               ZEXT1628(CONCAT412(fVar3 * fVar3,
                                  CONCAT48(fVar2 * fVar2,CONCAT44(fVar21 * fVar21,fVar1 * fVar1))));
          auVar152._8_4_ = 0x39506967;
          auVar152._0_8_ = 0x3950696739506967;
          auVar152._12_4_ = 0x39506967;
          auVar152._16_4_ = 0x39506967;
          auVar152._20_4_ = 0x39506967;
          auVar152._24_4_ = 0x39506967;
          auVar152._28_4_ = 0x39506967;
          auVar113._8_4_ = 0x3ab743ce;
          auVar113._0_8_ = 0x3ab743ce3ab743ce;
          auVar113._12_4_ = 0x3ab743ce;
          auVar113._16_4_ = 0x3ab743ce;
          auVar113._20_4_ = 0x3ab743ce;
          auVar113._24_4_ = 0x3ab743ce;
          auVar113._28_4_ = 0x3ab743ce;
          auVar56 = vfmadd213ps_fma(auVar152,auVar71,auVar113);
          auVar165._8_4_ = 0x3c088908;
          auVar165._0_8_ = 0x3c0889083c088908;
          auVar165._12_4_ = 0x3c088908;
          auVar165._16_4_ = 0x3c088908;
          auVar165._20_4_ = 0x3c088908;
          auVar165._24_4_ = 0x3c088908;
          auVar165._28_4_ = 0x3c088908;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar71,auVar165);
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar71,auVar93);
          auVar107._8_4_ = 0x3e2aaaaa;
          auVar107._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar107._12_4_ = 0x3e2aaaaa;
          auVar107._16_4_ = 0x3e2aaaaa;
          auVar107._20_4_ = 0x3e2aaaaa;
          auVar107._24_4_ = 0x3e2aaaaa;
          auVar107._28_4_ = 0x3e2aaaaa;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar107);
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar106);
          auVar42._0_4_ = fVar1 + 1.0;
          auVar42._4_4_ = fVar21 + 1.0;
          auVar42._8_4_ = fVar2 + 1.0;
          auVar42._12_4_ = fVar3 + 1.0;
          auVar42._16_4_ = 0x3f800000;
          auVar42._20_4_ = 0x3f800000;
          auVar42._24_4_ = 0x3f800000;
          auVar42._28_4_ = 0x3f800000;
          auVar56 = vfmadd231ps_fma(auVar42,auVar7,ZEXT1632(auVar56));
          auVar59._0_4_ = (int)auVar60._0_4_;
          auVar59._4_4_ = (int)auVar60._4_4_;
          auVar59._8_4_ = (int)auVar60._8_4_;
          auVar59._12_4_ = (int)auVar60._12_4_;
          auVar59._16_4_ = (int)auVar60._16_4_;
          auVar59._20_4_ = (int)auVar60._20_4_;
          auVar59._24_4_ = (int)auVar60._24_4_;
          auVar59._28_4_ = (int)auVar60._28_4_;
          auVar60 = vpslld_avx2(auVar59,0x17);
          auVar60 = vpaddd_avx2(auVar117,auVar60);
          auVar56 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar56),auVar116);
          auVar43._8_4_ = 0x800000;
          auVar43._0_8_ = 0x80000000800000;
          auVar43._12_4_ = 0x800000;
          auVar43._16_4_ = 0x800000;
          auVar43._20_4_ = 0x800000;
          auVar43._24_4_ = 0x800000;
          auVar43._28_4_ = 0x800000;
          auVar60 = vmaxps_avx(ZEXT1632(auVar56),auVar43);
          auVar71 = vpsrld_avx2(auVar60,0x17);
          auVar60 = vandps_avx(auVar60,auVar41);
          auVar80._8_4_ = 0x3f000000;
          auVar80._0_8_ = 0x3f0000003f000000;
          auVar80._12_4_ = 0x3f000000;
          auVar80._16_4_ = 0x3f000000;
          auVar80._20_4_ = 0x3f000000;
          auVar80._24_4_ = 0x3f000000;
          auVar80._28_4_ = 0x3f000000;
          auVar5 = vorps_avx(auVar60,auVar80);
          auVar81._8_4_ = 0xffffff82;
          auVar81._0_8_ = 0xffffff82ffffff82;
          auVar81._12_4_ = 0xffffff82;
          auVar81._16_4_ = 0xffffff82;
          auVar81._20_4_ = 0xffffff82;
          auVar81._24_4_ = 0xffffff82;
          auVar81._28_4_ = 0xffffff82;
          auVar39 = vpaddd_avx2(auVar71,auVar81);
          auVar82._8_4_ = 0x3f3504f3;
          auVar82._0_8_ = 0x3f3504f33f3504f3;
          auVar82._12_4_ = 0x3f3504f3;
          auVar82._16_4_ = 0x3f3504f3;
          auVar82._20_4_ = 0x3f3504f3;
          auVar82._24_4_ = 0x3f3504f3;
          auVar82._28_4_ = 0x3f3504f3;
          auVar71 = vcmpps_avx(auVar5,auVar82,1);
          auVar60 = vandps_avx(auVar71,auVar5);
          auVar137._8_4_ = 0xbf800000;
          auVar137._0_8_ = 0xbf800000bf800000;
          auVar137._12_4_ = 0xbf800000;
          auVar137._16_4_ = 0xbf800000;
          auVar137._20_4_ = 0xbf800000;
          auVar137._24_4_ = 0xbf800000;
          auVar137._28_4_ = 0xbf800000;
          auVar44._0_4_ = auVar5._0_4_ + -1.0 + auVar60._0_4_;
          auVar44._4_4_ = auVar5._4_4_ + -1.0 + auVar60._4_4_;
          auVar44._8_4_ = auVar5._8_4_ + -1.0 + auVar60._8_4_;
          auVar44._12_4_ = auVar5._12_4_ + -1.0 + auVar60._12_4_;
          auVar44._16_4_ = auVar5._16_4_ + -1.0 + auVar60._16_4_;
          auVar44._20_4_ = auVar5._20_4_ + -1.0 + auVar60._20_4_;
          auVar44._24_4_ = auVar5._24_4_ + -1.0 + auVar60._24_4_;
          auVar44._28_4_ = auVar5._28_4_ + -1.0 + auVar60._28_4_;
          auVar93._8_4_ = 0x3d2aa9c1;
          auVar93._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar93._12_4_ = 0x3d2aa9c1;
          auVar93._16_4_ = 0x3d2aa9c1;
          auVar93._20_4_ = 0x3d2aa9c1;
          auVar93._24_4_ = 0x3d2aa9c1;
          auVar93._28_4_ = 0x3d2aa9c1;
          auVar5 = vcmpps_avx(ZEXT1632(auVar56),_DAT_0030dda0,2);
          auVar39 = vcvtdq2ps_avx(auVar39);
          auVar60 = vandps_avx(auVar116,auVar71);
          auVar60 = vsubps_avx(auVar39,auVar60);
          auVar83._8_4_ = 0x3d9021bb;
          auVar83._0_8_ = 0x3d9021bb3d9021bb;
          auVar83._12_4_ = 0x3d9021bb;
          auVar83._16_4_ = 0x3d9021bb;
          auVar83._20_4_ = 0x3d9021bb;
          auVar83._24_4_ = 0x3d9021bb;
          auVar83._28_4_ = 0x3d9021bb;
          auVar98._8_4_ = 0xbdebd1b8;
          auVar98._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar98._12_4_ = 0xbdebd1b8;
          auVar98._16_4_ = 0xbdebd1b8;
          auVar98._20_4_ = 0xbdebd1b8;
          auVar98._24_4_ = 0xbdebd1b8;
          auVar98._28_4_ = 0xbdebd1b8;
          auVar56 = vfmadd213ps_fma(auVar83,auVar44,auVar98);
          auVar118._8_4_ = 0x3def251a;
          auVar118._0_8_ = 0x3def251a3def251a;
          auVar118._12_4_ = 0x3def251a;
          auVar118._16_4_ = 0x3def251a;
          auVar118._20_4_ = 0x3def251a;
          auVar118._24_4_ = 0x3def251a;
          auVar118._28_4_ = 0x3def251a;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar118);
          auVar119._8_4_ = 0xbdfe5d4f;
          auVar119._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar119._12_4_ = 0xbdfe5d4f;
          auVar119._16_4_ = 0xbdfe5d4f;
          auVar119._20_4_ = 0xbdfe5d4f;
          auVar119._24_4_ = 0xbdfe5d4f;
          auVar119._28_4_ = 0xbdfe5d4f;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar119);
          auVar120._8_4_ = 0x3e11e9bf;
          auVar120._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar120._12_4_ = 0x3e11e9bf;
          auVar120._16_4_ = 0x3e11e9bf;
          auVar120._20_4_ = 0x3e11e9bf;
          auVar120._24_4_ = 0x3e11e9bf;
          auVar120._28_4_ = 0x3e11e9bf;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar120);
          auVar121._8_4_ = 0xbe2aae50;
          auVar121._0_8_ = 0xbe2aae50be2aae50;
          auVar121._12_4_ = 0xbe2aae50;
          auVar121._16_4_ = 0xbe2aae50;
          auVar121._20_4_ = 0xbe2aae50;
          auVar121._24_4_ = 0xbe2aae50;
          auVar121._28_4_ = 0xbe2aae50;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar121);
          auVar122._8_4_ = 0x3e4cceac;
          auVar122._0_8_ = 0x3e4cceac3e4cceac;
          auVar122._12_4_ = 0x3e4cceac;
          auVar122._16_4_ = 0x3e4cceac;
          auVar122._20_4_ = 0x3e4cceac;
          auVar122._24_4_ = 0x3e4cceac;
          auVar122._28_4_ = 0x3e4cceac;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar122);
          auVar123._8_4_ = 0xbe7ffffc;
          auVar123._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar123._12_4_ = 0xbe7ffffc;
          auVar123._16_4_ = 0xbe7ffffc;
          auVar123._20_4_ = 0xbe7ffffc;
          auVar123._24_4_ = 0xbe7ffffc;
          auVar123._28_4_ = 0xbe7ffffc;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar123);
          auVar124._8_4_ = 0x3eaaaaaa;
          auVar124._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar124._12_4_ = 0x3eaaaaaa;
          auVar124._16_4_ = 0x3eaaaaaa;
          auVar124._20_4_ = 0x3eaaaaaa;
          auVar124._24_4_ = 0x3eaaaaaa;
          auVar124._28_4_ = 0x3eaaaaaa;
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar44,auVar124);
          auVar24 = vfmsub213ps_fma(ZEXT1632(auVar56),auVar44,auVar106);
          auVar56 = vfmadd213ps_fma(auVar60,auVar97,auVar44);
          auVar8._4_4_ = auVar44._4_4_ * auVar44._4_4_;
          auVar8._0_4_ = auVar44._0_4_ * auVar44._0_4_;
          auVar8._8_4_ = auVar44._8_4_ * auVar44._8_4_;
          auVar8._12_4_ = auVar44._12_4_ * auVar44._12_4_;
          auVar8._16_4_ = auVar44._16_4_ * auVar44._16_4_;
          auVar8._20_4_ = auVar44._20_4_ * auVar44._20_4_;
          auVar8._24_4_ = auVar44._24_4_ * auVar44._24_4_;
          auVar8._28_4_ = auVar44._28_4_;
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar8,ZEXT1632(auVar24));
          auVar125._8_4_ = 0xc0000000;
          auVar125._0_8_ = 0xc0000000c0000000;
          auVar125._12_4_ = 0xc0000000;
          auVar125._16_4_ = 0xc0000000;
          auVar125._20_4_ = 0xc0000000;
          auVar125._24_4_ = 0xc0000000;
          auVar125._28_4_ = 0xc0000000;
          auVar9._4_4_ = auVar56._4_4_ * -2.0;
          auVar9._0_4_ = auVar56._0_4_ * -2.0;
          auVar9._8_4_ = auVar56._8_4_ * -2.0;
          auVar9._12_4_ = auVar56._12_4_ * -2.0;
          auVar9._16_4_ = 0x80000000;
          auVar9._20_4_ = 0x80000000;
          auVar9._24_4_ = 0x80000000;
          auVar9._28_4_ = auVar44._28_4_;
          auVar72._8_4_ = 0x7fffffff;
          auVar72._0_8_ = 0x7fffffff7fffffff;
          auVar72._12_4_ = 0x7fffffff;
          auVar72._16_4_ = 0x7fffffff;
          auVar72._20_4_ = 0x7fffffff;
          auVar72._24_4_ = 0x7fffffff;
          auVar72._28_4_ = 0x7fffffff;
          auVar60 = vblendvps_avx(auVar9,auVar72,auVar5);
          auVar61._8_4_ = 0x42b0c0a5;
          auVar61._0_8_ = 0x42b0c0a542b0c0a5;
          auVar61._12_4_ = 0x42b0c0a5;
          auVar61._16_4_ = 0x42b0c0a5;
          auVar61._20_4_ = 0x42b0c0a5;
          auVar61._24_4_ = 0x42b0c0a5;
          auVar61._28_4_ = 0x42b0c0a5;
          auVar60 = vminps_avx(auVar60,auVar61);
          auVar62._8_4_ = 0xc2b0c0a5;
          auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar62._12_4_ = 0xc2b0c0a5;
          auVar62._16_4_ = 0xc2b0c0a5;
          auVar62._20_4_ = 0xc2b0c0a5;
          auVar62._24_4_ = 0xc2b0c0a5;
          auVar62._28_4_ = 0xc2b0c0a5;
          auVar71 = vmaxps_avx(auVar60,auVar62);
          auVar56 = vfmadd213ps_fma(auVar169,auVar71,auVar106);
          auVar5 = vroundps_avx(ZEXT1632(auVar56),1);
          auVar60 = vcmpps_avx(ZEXT1632(auVar56),auVar5,1);
          auVar60 = vandps_avx(auVar116,auVar60);
          auVar60 = vsubps_avx(auVar5,auVar60);
          auVar24 = vfnmadd231ps_fma(auVar71,auVar60,auVar97);
          auVar71 = ZEXT1632(auVar24);
          fVar1 = auVar24._0_4_;
          fVar21 = auVar24._4_4_;
          fVar2 = auVar24._8_4_;
          fVar3 = auVar24._12_4_;
          auVar10._28_4_ = auVar5._28_4_;
          auVar10._0_28_ =
               ZEXT1628(CONCAT412(fVar3 * fVar3,
                                  CONCAT48(fVar2 * fVar2,CONCAT44(fVar21 * fVar21,fVar1 * fVar1))));
          auVar56 = vfmadd213ps_fma(auVar152,auVar71,auVar113);
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar71,auVar165);
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar71,auVar93);
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar107);
          auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar24),auVar106);
          auVar45._0_4_ = fVar1 + 1.0;
          auVar45._4_4_ = fVar21 + 1.0;
          auVar45._8_4_ = fVar2 + 1.0;
          auVar45._12_4_ = fVar3 + 1.0;
          auVar45._16_4_ = 0x3f800000;
          auVar45._20_4_ = 0x3f800000;
          auVar45._24_4_ = 0x3f800000;
          auVar45._28_4_ = 0x3f800000;
          auVar56 = vfmadd231ps_fma(auVar45,auVar10,ZEXT1632(auVar56));
          auVar63._0_4_ = (int)auVar60._0_4_;
          auVar63._4_4_ = (int)auVar60._4_4_;
          auVar63._8_4_ = (int)auVar60._8_4_;
          auVar63._12_4_ = (int)auVar60._12_4_;
          auVar63._16_4_ = (int)auVar60._16_4_;
          auVar63._20_4_ = (int)auVar60._20_4_;
          auVar63._24_4_ = (int)auVar60._24_4_;
          auVar63._28_4_ = (int)auVar60._28_4_;
          auVar60 = vpslld_avx2(auVar63,0x17);
          auVar60 = vpaddd_avx2(auVar117,auVar60);
          auVar56 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar56),auVar116);
          auVar60 = vrcpps_avx(ZEXT1632(auVar56));
          auVar56 = vfmsub213ps_fma(ZEXT1632(auVar56),auVar60,auVar116);
          auVar56 = vfnmadd132ps_fma(ZEXT1632(auVar56),auVar60,auVar60);
          auVar56 = vfnmadd213ps_fma(ZEXT1632(auVar56),auVar125,auVar137);
          local_a8 = auVar28._0_4_;
          fStack_a4 = auVar28._4_4_;
          fStack_a0 = auVar28._8_4_;
          fStack_9c = auVar28._12_4_;
          fStack_98 = auVar28._16_4_;
          fStack_94 = auVar28._20_4_;
          fStack_90 = auVar28._24_4_;
          auVar11._4_4_ = auVar56._4_4_ * fStack_a4;
          auVar11._0_4_ = auVar56._0_4_ * local_a8;
          auVar11._8_4_ = auVar56._8_4_ * fStack_a0;
          auVar11._12_4_ = auVar56._12_4_ * fStack_9c;
          auVar11._16_4_ = fStack_98 * 0.0;
          auVar11._20_4_ = fStack_94 * 0.0;
          auVar11._24_4_ = fStack_90 * 0.0;
          auVar11._28_4_ = 0x3f000000;
          *pauVar19 = auVar11;
          pauVar19 = pauVar19 + 1;
          iVar12 = iVar12 + 8;
          uVar16 = uVar17 & 0xfffffff8;
        } while (iVar12 < (int)uVar17);
      }
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar56._8_4_ = 0x3c088908;
      auVar56._0_8_ = 0x3c0889083c088908;
      auVar56._12_4_ = 0x3c088908;
      uVar14 = uVar16 | 3;
      while ((int)uVar14 < (int)uVar17) {
        auVar36 = *(undefined1 (*) [16])*pauVar19;
        auVar109._8_4_ = 0x42b0c0a5;
        auVar109._0_8_ = 0x42b0c0a542b0c0a5;
        auVar109._12_4_ = 0x42b0c0a5;
        auVar99 = vminps_avx(auVar109,auVar36);
        auVar112._8_4_ = 0xc2b0c0a5;
        auVar112._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar112._12_4_ = 0xc2b0c0a5;
        auVar27 = vmaxps_avx(auVar112,auVar99);
        auVar164._8_4_ = 0x3fb8aa3b;
        auVar164._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar164._12_4_ = 0x3fb8aa3b;
        auVar26._8_4_ = 0x3f000000;
        auVar26._0_8_ = 0x3f0000003f000000;
        auVar26._12_4_ = 0x3f000000;
        auVar99 = vfmadd213ps_fma(auVar164,auVar27,auVar26);
        auVar64._0_4_ = (int)auVar99._0_4_;
        auVar64._4_4_ = (int)auVar99._4_4_;
        auVar64._8_4_ = (int)auVar99._8_4_;
        auVar64._12_4_ = (int)auVar99._12_4_;
        auVar64 = vcvtdq2ps_avx(auVar64);
        auVar99 = vcmpps_avx(auVar99,auVar64,1);
        auVar99 = vandps_avx(auVar24,auVar99);
        auVar99 = vsubps_avx(auVar64,auVar99);
        auVar115._8_4_ = 0x3f317218;
        auVar115._0_8_ = 0x3f3172183f317218;
        auVar115._12_4_ = 0x3f317218;
        auVar27 = vfnmadd231ps_fma(auVar27,auVar99,auVar115);
        fVar1 = auVar27._0_4_;
        auVar65._0_4_ = fVar1 * fVar1;
        fVar21 = auVar27._4_4_;
        auVar65._4_4_ = fVar21 * fVar21;
        fVar2 = auVar27._8_4_;
        auVar65._8_4_ = fVar2 * fVar2;
        fVar3 = auVar27._12_4_;
        auVar65._12_4_ = fVar3 * fVar3;
        auVar167._8_4_ = 0x39506967;
        auVar167._0_8_ = 0x3950696739506967;
        auVar167._12_4_ = 0x39506967;
        auVar127._8_4_ = 0x3ab743ce;
        auVar127._0_8_ = 0x3ab743ce3ab743ce;
        auVar127._12_4_ = 0x3ab743ce;
        auVar64 = vfmadd213ps_fma(auVar167,auVar27,auVar127);
        auVar56 = vfmadd213ps_fma(auVar64,auVar27,auVar56);
        auVar100._8_4_ = 0x3d2aa9c1;
        auVar100._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar100._12_4_ = 0x3d2aa9c1;
        auVar56 = vfmadd213ps_fma(auVar56,auVar27,auVar100);
        auVar142._8_4_ = 0x3e2aaaaa;
        auVar142._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar142._12_4_ = 0x3e2aaaaa;
        auVar56 = vfmadd213ps_fma(auVar56,auVar27,auVar142);
        auVar56 = vfmadd213ps_fma(auVar56,auVar27,auVar26);
        auVar88._0_4_ = fVar1 + 1.0;
        auVar88._4_4_ = fVar21 + 1.0;
        auVar88._8_4_ = fVar2 + 1.0;
        auVar88._12_4_ = fVar3 + 1.0;
        auVar64 = vfmadd231ps_fma(auVar88,auVar65,auVar56);
        auVar55._0_4_ = (int)auVar99._0_4_;
        auVar55._4_4_ = (int)auVar99._4_4_;
        auVar55._8_4_ = (int)auVar99._8_4_;
        auVar55._12_4_ = (int)auVar99._12_4_;
        auVar37._8_4_ = 0x3f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        auVar37._12_4_ = 0x3f800000;
        auVar56 = vpslld_avx(auVar55,0x17);
        auVar56 = vpaddd_avx(auVar56,auVar37);
        auVar55 = vfmadd213ps_fma(auVar56,auVar64,auVar24);
        auVar99._8_4_ = 0x800000;
        auVar99._0_8_ = 0x80000000800000;
        auVar99._12_4_ = 0x800000;
        auVar56 = vmaxps_avx(auVar55,auVar99);
        auVar99 = vpsrld_avx(auVar56,0x17);
        auVar89._8_4_ = 0x807fffff;
        auVar89._0_8_ = 0x807fffff807fffff;
        auVar89._12_4_ = 0x807fffff;
        auVar56 = vandps_avx(auVar56,auVar89);
        auVar90._8_4_ = 0x3f000000;
        auVar90._0_8_ = 0x3f0000003f000000;
        auVar90._12_4_ = 0x3f000000;
        auVar96._8_4_ = 0xffffff82;
        auVar96._0_8_ = 0xffffff82ffffff82;
        auVar96._12_4_ = 0xffffff82;
        auVar64 = vorps_avx(auVar56,auVar90);
        auVar27 = vpaddd_avx(auVar99,auVar96);
        auVar91._8_4_ = 0x3f3504f3;
        auVar91._0_8_ = 0x3f3504f33f3504f3;
        auVar91._12_4_ = 0x3f3504f3;
        auVar99 = vcmpps_avx(auVar64,auVar91,1);
        auVar56 = vandps_avx(auVar99,auVar64);
        auVar66._0_4_ = auVar64._0_4_ + -1.0 + auVar56._0_4_;
        auVar66._4_4_ = auVar64._4_4_ + -1.0 + auVar56._4_4_;
        auVar66._8_4_ = auVar64._8_4_ + -1.0 + auVar56._8_4_;
        auVar66._12_4_ = auVar64._12_4_ + -1.0 + auVar56._12_4_;
        auVar56._8_4_ = 0x3c088908;
        auVar56._0_8_ = 0x3c0889083c088908;
        auVar56._12_4_ = 0x3c088908;
        auVar64 = vcmpps_avx(auVar55,_DAT_0030b030,2);
        auVar27 = vcvtdq2ps_avx(auVar27);
        auVar99 = vandps_avx(auVar24,auVar99);
        auVar99 = vsubps_avx(auVar27,auVar99);
        auVar92._8_4_ = 0x3d9021bb;
        auVar92._0_8_ = 0x3d9021bb3d9021bb;
        auVar92._12_4_ = 0x3d9021bb;
        auVar143._8_4_ = 0xbdebd1b8;
        auVar143._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar143._12_4_ = 0xbdebd1b8;
        auVar27 = vfmadd213ps_fma(auVar92,auVar66,auVar143);
        auVar144._8_4_ = 0x3def251a;
        auVar144._0_8_ = 0x3def251a3def251a;
        auVar144._12_4_ = 0x3def251a;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar144);
        auVar145._8_4_ = 0xbdfe5d4f;
        auVar145._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar145._12_4_ = 0xbdfe5d4f;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar145);
        auVar146._8_4_ = 0x3e11e9bf;
        auVar146._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar146._12_4_ = 0x3e11e9bf;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar146);
        auVar147._8_4_ = 0xbe2aae50;
        auVar147._0_8_ = 0xbe2aae50be2aae50;
        auVar147._12_4_ = 0xbe2aae50;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar147);
        auVar148._8_4_ = 0x3e4cceac;
        auVar148._0_8_ = 0x3e4cceac3e4cceac;
        auVar148._12_4_ = 0x3e4cceac;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar148);
        auVar149._8_4_ = 0xbe7ffffc;
        auVar149._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar149._12_4_ = 0xbe7ffffc;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar149);
        auVar150._8_4_ = 0x3eaaaaaa;
        auVar150._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar150._12_4_ = 0x3eaaaaaa;
        auVar27 = vfmadd213ps_fma(auVar27,auVar66,auVar150);
        auVar27 = vfmsub213ps_fma(auVar27,auVar66,auVar26);
        auVar99 = vfmadd213ps_fma(auVar99,auVar115,auVar66);
        auVar67._0_4_ = auVar66._0_4_ * auVar66._0_4_;
        auVar67._4_4_ = auVar66._4_4_ * auVar66._4_4_;
        auVar67._8_4_ = auVar66._8_4_ * auVar66._8_4_;
        auVar67._12_4_ = auVar66._12_4_ * auVar66._12_4_;
        auVar99 = vfmadd231ps_fma(auVar99,auVar67,auVar27);
        auVar68._0_4_ = auVar99._0_4_ * -2.0;
        auVar68._4_4_ = auVar99._4_4_ * -2.0;
        auVar68._8_4_ = auVar99._8_4_ * -2.0;
        auVar68._12_4_ = auVar99._12_4_ * -2.0;
        auVar75._8_4_ = 0x7fffffff;
        auVar75._0_8_ = 0x7fffffff7fffffff;
        auVar75._12_4_ = 0x7fffffff;
        auVar99 = vblendvps_avx(auVar68,auVar75,auVar64);
        auVar99 = vminps_avx(auVar109,auVar99);
        auVar27 = vmaxps_avx(auVar112,auVar99);
        auVar99 = vfmadd213ps_fma(auVar164,auVar27,auVar26);
        auVar76._0_4_ = (int)auVar99._0_4_;
        auVar76._4_4_ = (int)auVar99._4_4_;
        auVar76._8_4_ = (int)auVar99._8_4_;
        auVar76._12_4_ = (int)auVar99._12_4_;
        auVar64 = vcvtdq2ps_avx(auVar76);
        auVar99 = vcmpps_avx(auVar99,auVar64,1);
        auVar99 = vandps_avx(auVar24,auVar99);
        auVar99 = vsubps_avx(auVar64,auVar99);
        auVar27 = vfnmadd231ps_fma(auVar27,auVar99,auVar115);
        fVar1 = auVar27._0_4_;
        auVar77._0_4_ = fVar1 * fVar1;
        fVar21 = auVar27._4_4_;
        auVar77._4_4_ = fVar21 * fVar21;
        fVar2 = auVar27._8_4_;
        auVar77._8_4_ = fVar2 * fVar2;
        fVar3 = auVar27._12_4_;
        auVar77._12_4_ = fVar3 * fVar3;
        auVar64 = vfmadd213ps_fma(auVar167,auVar27,auVar127);
        auVar64 = vfmadd213ps_fma(auVar64,auVar27,auVar56);
        auVar64 = vfmadd213ps_fma(auVar64,auVar27,auVar100);
        auVar101._8_4_ = 0x3e2aaaaa;
        auVar101._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar101._12_4_ = 0x3e2aaaaa;
        auVar64 = vfmadd213ps_fma(auVar64,auVar27,auVar101);
        auVar64 = vfmadd213ps_fma(auVar64,auVar27,auVar26);
        auVar57._0_4_ = fVar1 + 1.0;
        auVar57._4_4_ = fVar21 + 1.0;
        auVar57._8_4_ = fVar2 + 1.0;
        auVar57._12_4_ = fVar3 + 1.0;
        auVar64 = vfmadd231ps_fma(auVar57,auVar77,auVar64);
        auVar69._0_4_ = (int)auVar99._0_4_;
        auVar69._4_4_ = (int)auVar99._4_4_;
        auVar69._8_4_ = (int)auVar99._8_4_;
        auVar69._12_4_ = (int)auVar99._12_4_;
        auVar99 = vpslld_avx(auVar69,0x17);
        auVar99 = vpaddd_avx(auVar99,auVar37);
        auVar64 = vfmadd213ps_fma(auVar99,auVar64,auVar24);
        auVar99 = vrcpps_avx(auVar64);
        auVar70._0_4_ = auVar99._0_4_ + auVar99._0_4_;
        auVar70._4_4_ = auVar99._4_4_ + auVar99._4_4_;
        auVar70._8_4_ = auVar99._8_4_ + auVar99._8_4_;
        auVar70._12_4_ = auVar99._12_4_ + auVar99._12_4_;
        auVar27._8_4_ = 0x40000000;
        auVar27._0_8_ = 0x4000000040000000;
        auVar27._12_4_ = 0x40000000;
        auVar64 = vfmsub213ps_fma(auVar64,auVar70,auVar27);
        auVar99 = vfnmadd213ps_fma(auVar64,auVar99,auVar70);
        auVar36 = vfmsub213ps_fma(auVar99,auVar36,auVar36);
        *(undefined1 (*) [16])*pauVar19 = auVar36;
        pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
        uVar14 = uVar16 + 7;
        uVar16 = uVar16 + 4;
      }
      if (uVar17 - uVar16 != 0 && (int)uVar16 <= (int)uVar17) {
        lVar20 = 0;
        do {
          fVar1 = *(float *)(*pauVar19 + lVar20 * 4);
          fVar21 = expf(fVar1);
          fVar21 = logf(fVar21 + 1.0);
          fVar21 = tanhf(fVar21);
          *(float *)(*pauVar19 + lVar20 * 4) = fVar21 * fVar1;
          lVar20 = lVar20 + 1;
        } while (uVar17 - uVar16 != (int)lVar20);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar18);
  }
  return 0;
}

Assistant:

int Mish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}